

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O3

void __thiscall iqxmlrpc::Date_time::Date_time(Date_time *this,string *s)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  Malformed_iso8601 *pMVar4;
  char alpha [13];
  long *local_58 [2];
  long local_48 [2];
  char local_38 [16];
  
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Date_time_0018b070;
  (this->cache)._M_dataplus._M_p = (pointer)&(this->cache).field_2;
  (this->cache)._M_string_length = 0;
  (this->cache).field_2._M_local_buf[0] = '\0';
  if ((s->_M_string_length != 0x11) || ((s->_M_dataplus)._M_p[8] != 'T')) {
    pMVar4 = (Malformed_iso8601 *)__cxa_allocate_exception(0x18);
    Malformed_iso8601::Malformed_iso8601(pMVar4);
    __cxa_throw(pMVar4,&Malformed_iso8601::typeinfo,std::runtime_error::~runtime_error);
  }
  builtin_strncpy(local_38 + 8,"89T:",5);
  builtin_strncpy(local_38,"01234567",8);
  std::__cxx11::string::substr((ulong)local_58,(ulong)s);
  strlen(local_38);
  lVar3 = std::__cxx11::string::find_first_not_of((char *)local_58,(ulong)local_38,0);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (lVar3 == -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)s);
    plVar1 = local_58[0];
    iVar2 = atoi((char *)local_58[0]);
    (this->tm_).tm_year = iVar2 + -0x76c;
    if (plVar1 != local_48) {
      operator_delete(plVar1,local_48[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)s);
    plVar1 = local_58[0];
    iVar2 = atoi((char *)local_58[0]);
    (this->tm_).tm_mon = iVar2 + -1;
    if (plVar1 != local_48) {
      operator_delete(plVar1,local_48[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)s);
    plVar1 = local_58[0];
    iVar2 = atoi((char *)local_58[0]);
    (this->tm_).tm_mday = iVar2;
    if (plVar1 != local_48) {
      operator_delete(plVar1,local_48[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)s);
    plVar1 = local_58[0];
    iVar2 = atoi((char *)local_58[0]);
    (this->tm_).tm_hour = iVar2;
    if (plVar1 != local_48) {
      operator_delete(plVar1,local_48[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)s);
    plVar1 = local_58[0];
    iVar2 = atoi((char *)local_58[0]);
    (this->tm_).tm_min = iVar2;
    if (plVar1 != local_48) {
      operator_delete(plVar1,local_48[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)s);
    iVar2 = atoi((char *)local_58[0]);
    (this->tm_).tm_sec = iVar2;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if ((((-1 < (this->tm_).tm_year) && ((uint)(this->tm_).tm_mon < 0xc)) &&
        ((this->tm_).tm_mday - 1U < 0x1f)) &&
       ((((uint)(this->tm_).tm_hour < 0x18 && ((uint)(this->tm_).tm_min < 0x3c)) &&
        ((uint)(this->tm_).tm_sec < 0x3e)))) {
      return;
    }
    pMVar4 = (Malformed_iso8601 *)__cxa_allocate_exception(0x18);
    Malformed_iso8601::Malformed_iso8601(pMVar4);
  }
  else {
    pMVar4 = (Malformed_iso8601 *)__cxa_allocate_exception(0x18);
    Malformed_iso8601::Malformed_iso8601(pMVar4);
  }
  __cxa_throw(pMVar4,&Malformed_iso8601::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Date_time::Date_time( const std::string& s )
{
  if( s.length() != 17 || s[8] != 'T' )
    throw Malformed_iso8601();

  char alpha[] = "0123456789T:";
  if( s.substr(0, 16).find_first_not_of(alpha) != std::string::npos )
    throw Malformed_iso8601();

  tm_.tm_year = atoi( s.substr(0, 4).c_str() ) - 1900;
  tm_.tm_mon  = atoi( s.substr(4, 2).c_str() ) - 1;
  tm_.tm_mday = atoi( s.substr(6, 2).c_str() );
  tm_.tm_hour = atoi( s.substr(9, 2).c_str() );
  tm_.tm_min  = atoi( s.substr(12, 2).c_str() );
  tm_.tm_sec  = atoi( s.substr(15, 2).c_str() );

  if( (tm_.tm_year < 0) || !(tm_.tm_mon >= 0 && tm_.tm_mon <= 11) ||
      !(tm_.tm_mday >= 1 && tm_.tm_mday <= 31) ||
      !(tm_.tm_hour >= 0 && tm_.tm_hour <= 23) ||
      !(tm_.tm_min >= 0 && tm_.tm_min <= 59) ||
      !(tm_.tm_sec >= 0 && tm_.tm_sec <= 61)
    )
    throw Malformed_iso8601();
}